

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<int,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),int(*)(double_const*,pbrt::FileLoc_const*)>
          (ParameterDictionary *this,string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_int_double_ptr_FileLoc_ptr *convert)

{
  undefined8 uVar1;
  __type _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  ParsedParameter *unaff_retaddr;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *in_stack_00000008;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  char *in_stack_ffffffffffffff98;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *pIVar4;
  int nPerItem_00;
  
  this_00 = in_RDI;
  pIVar4 = in_RDI;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::begin(in_RSI);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
          ::end(this_00);
  do {
    if (__lhs == __rhs) {
      memset(this_00,0,0x18);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x758240);
      return (vector<int,_std::allocator<int>_> *)in_RDI;
    }
    uVar1 = *(undefined8 *)__lhs;
    _Var2 = std::operator==(__lhs,__rhs);
    if (_Var2) {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this_00,in_stack_ffffffffffffff98);
      nPerItem_00 = (int)((ulong)pIVar4 >> 0x20);
      if (bVar3) {
        (*(code *)in_stack_00000008)(uVar1);
        returnArray<int,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>,int(*)(double_const*,pbrt::FileLoc_const*)>
                  (in_stack_00000008,unaff_retaddr,nPerItem_00,
                   (_func_int_double_ptr_FileLoc_ptr *)in_RSI);
        return (vector<int,_std::allocator<int>_> *)in_RDI;
      }
    }
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &__lhs->_M_string_length;
  } while( true );
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}